

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StronglyRegularToFA.h
# Opt level: O3

void __thiscall
covenant::StronglyRegularToFA<covenant::Sym>::make_fa
          (StronglyRegularToFA<covenant::Sym> *this,State q_0,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *alpha,State q_1,
          SymStateMap *SymToState)

{
  int iVar1;
  pointer pvVar2;
  pointer pSVar3;
  bool bVar4;
  State SVar5;
  const_iterator cVar6;
  ostream *poVar7;
  ulong uVar8;
  pointer pSVar9;
  node_pointer ppVar10;
  node_pointer ppVar11;
  undefined4 extraout_var;
  vector<int,_std::allocator<int>_> *pvVar12;
  undefined4 extraout_var_00;
  long lVar13;
  pointer pPVar14;
  undefined4 extraout_var_01;
  ulong uVar15;
  ulong uVar16;
  _Base_ptr p_Var17;
  Sym *pSVar18;
  uint uVar19;
  DFA<covenant::Sym> *pDVar20;
  bool bVar21;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS_1;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> GroupSyms;
  undefined1 local_240 [32];
  StronglyRegularToFA<covenant::Sym> *local_220;
  table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
  *local_218;
  State local_210;
  State local_20c;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_208;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_1f0;
  ulong local_1d8;
  undefined8 local_1d0;
  DFA<covenant::Sym> *local_1c8;
  table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
  *local_1c0;
  ulong local_1b8;
  _Base_ptr local_1b0;
  long local_1a8;
  DFA<covenant::Sym> *local_1a0;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_198;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_180;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_168;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_150;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_138;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_120;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_108;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_f0;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_d8;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_c0;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_a8;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_48;
  
  local_220 = this;
  local_218 = (table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
               *)SymToState;
  local_210.id = q_0.id;
  local_20c.id = q_1.id;
  if (avy::AvyLogFlag == 1) {
    local_240._0_8_ = (Sym *)(local_240 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"abstraction-mkFA","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)avy::AvyLog_abi_cxx11_,(key_type *)local_240);
    if ((Sym *)local_240._0_8_ != (Sym *)(local_240 + 0x10)) {
      operator_delete((void *)local_240._0_8_);
    }
    this = local_220;
    if (cVar6._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading word ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
      pSVar9 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
          super__Vector_impl_data._M_finish != pSVar9) {
        uVar8 = 0;
        uVar15 = 1;
        do {
          poVar7 = operator<<((ostream *)&std::cout,(Sym)pSVar9[uVar8].x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
          pSVar9 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          bVar4 = uVar15 < (ulong)((long)(alpha->
                                         super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar9
                                  >> 2);
          uVar8 = uVar15;
          uVar15 = (ulong)((int)uVar15 + 1);
        } while (bVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," with size ",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      SymToState = (SymStateMap *)local_218;
    }
  }
  pSVar9 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pSVar9 >> 2;
  if (uVar8 == 1) {
    if ((pSVar9->x & 1) == 0) {
      if ((avy::AvyLogFlag & 1) != 0) {
        local_240._0_8_ = (Sym *)(local_240 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"abstraction-mkFA","");
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)avy::AvyLog_abi_cxx11_,(key_type *)local_240);
        if ((Sym *)local_240._0_8_ != (Sym *)(local_240 + 0x10)) {
          operator_delete((void *)local_240._0_8_);
        }
        this = local_220;
        if (cVar6._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[make_fa] (case A->a) reading ",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
          pSVar9 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if ((alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
              super__Vector_impl_data._M_finish != pSVar9) {
            uVar8 = 0;
            uVar15 = 1;
            do {
              poVar7 = operator<<((ostream *)&std::cout,(Sym)pSVar9[uVar8].x);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
              pSVar9 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              bVar4 = uVar15 < (ulong)((long)(alpha->
                                             super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pSVar9 >> 2);
              uVar8 = uVar15;
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (bVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
          std::ostream::put(-0x48);
          std::ostream::flush();
        }
      }
      DFA<covenant::Sym>::transition
                (&this->dfa,local_210,
                 (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
                 super__Vector_impl_data._M_start,local_20c);
      return;
    }
  }
  else {
    if (uVar8 == 0) {
      if (avy::AvyLogFlag == 1) {
        local_240._0_8_ = (Sym *)(local_240 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"abstraction-mkFA","");
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)avy::AvyLog_abi_cxx11_,(key_type *)local_240);
        if ((Sym *)local_240._0_8_ != (Sym *)(local_240 + 0x10)) {
          operator_delete((void *)local_240._0_8_);
        }
        this = local_220;
        if (cVar6._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[make_fa] reading epsilon\n",0x1a);
        }
      }
      DFA<covenant::Sym>::eps_transition(&this->dfa,local_210,local_20c);
      return;
    }
    if (1 < uVar8) {
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector(&local_1f0,alpha);
      remove<covenant::Sym>(&local_1f0,0);
      SVar5 = DFA<covenant::Sym>::state
                        (&this->dfa,
                         (int)((ulong)((long)(this->dfa).trans.
                                             super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->dfa).trans.
                                            super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         -0x55555555);
      local_208.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_start = (Sym *)0x0;
      local_208.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_finish = (Sym *)0x0;
      local_208.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
      _M_realloc_insert<covenant::Sym_const&>
                ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_208,(iterator)0x0,
                 (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
                 super__Vector_impl_data._M_start);
      if (avy::AvyLogFlag == 1) {
        local_240._0_8_ = (Sym *)(local_240 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"abstraction-mkFA","");
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)avy::AvyLog_abi_cxx11_,(key_type *)local_240);
        if ((Sym *)local_240._0_8_ != (Sym *)(local_240 + 0x10)) {
          operator_delete((void *)local_240._0_8_);
        }
        this = local_220;
        if (cVar6._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[make_fa] (case A-> BC) reading ",0x20);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
          if (local_208.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_208.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar8 = 0;
            uVar15 = 1;
            do {
              poVar7 = operator<<((ostream *)&std::cout,
                                  (Sym)local_208.
                                       super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar8].x);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
              bVar4 = uVar15 < (ulong)((long)local_208.
                                             super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_208.
                                             super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 2);
              uVar8 = uVar15;
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (bVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
          if (local_1f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_1f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar8 = 0;
            uVar15 = 1;
            do {
              poVar7 = operator<<((ostream *)&std::cout,
                                  (Sym)local_1f0.
                                       super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar8].x);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
              bVar4 = uVar15 < (ulong)((long)local_1f0.
                                             super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_1f0.
                                             super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 2);
              uVar8 = uVar15;
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (bVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
          this = local_220;
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
          std::ostream::put(-0x48);
          std::ostream::flush();
        }
      }
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector(&local_90,&local_208);
      make_fa(this,local_210,&local_90,SVar5,(SymStateMap *)local_218);
      if (local_90.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector(&local_a8,&local_1f0);
      make_fa(this,SVar5,&local_a8,local_20c,(SymStateMap *)local_218);
      if (local_a8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      pSVar9 = local_1f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_208.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_start != (Sym *)0x0) {
        operator_delete(local_208.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        pSVar9 = local_1f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl
                 .super__Vector_impl_data._M_start;
      }
      goto LAB_00151ae9;
    }
  }
  if ((avy::AvyLogFlag & 1) != 0) {
    local_240._0_8_ = (Sym *)(local_240 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"abstraction-mkFA","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)avy::AvyLog_abi_cxx11_,(key_type *)local_240);
    if ((Sym *)local_240._0_8_ != (Sym *)(local_240 + 0x10)) {
      operator_delete((void *)local_240._0_8_);
    }
    this = local_220;
    if (cVar6._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[make_fa] (case A->B) reading ",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
      pSVar9 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
          super__Vector_impl_data._M_finish != pSVar9) {
        uVar8 = 0;
        uVar15 = 1;
        do {
          poVar7 = operator<<((ostream *)&std::cout,(Sym)pSVar9[uVar8].x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
          pSVar9 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          bVar4 = uVar15 < (ulong)((long)(alpha->
                                         super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar9
                                  >> 2);
          uVar8 = uVar15;
          uVar15 = (ulong)((int)uVar15 + 1);
        } while (bVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
      SymToState = (SymStateMap *)local_218;
    }
  }
  uVar19 = ((alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
            super__Vector_impl_data._M_start)->x >> 1;
  uVar8 = (ulong)uVar19;
  local_240._0_4_ = uVar19;
  ppVar10 = boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
            ::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                        *)&this->sym_scc_map,uVar8,(uint *)local_240,
                       (equal_to<unsigned_int> *)
                       ((this->sym_scc_map).table_.
                        super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>.
                        funcs_ + ((this->sym_scc_map).table_.
                                  super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                                  .current_ & 1)));
  if ((this->recursive).
      super__Vector_base<covenant::RecursiveType,_std::allocator<covenant::RecursiveType>_>._M_impl.
      super__Vector_impl_data._M_start[*(uint *)((long)&(ppVar10->value_base_).data_.data_ + 4)] ==
      NON_REC) {
    if (avy::AvyLogFlag == 1) {
      local_240._0_8_ = local_240 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"abstraction-mkFA","");
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,(key_type *)local_240);
      if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
        operator_delete((void *)local_240._0_8_);
      }
      this = local_220;
      if (cVar6._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[make_fa] A is not recursive\n ",0x1e);
      }
    }
    pvVar2 = (this->g).prods.
             super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar14 = pvVar2[(int)uVar19].
              super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pvVar2[(int)uVar19].
                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                 ._M_impl.super__Vector_impl_data + 8) == pPVar14) {
      return;
    }
    uVar8 = 0;
    uVar15 = 1;
    do {
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)local_240,
                 (this->g).rules.
                 super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + pPVar14[uVar8].rule);
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                (&local_48,(vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)local_240);
      make_fa(this,local_210,&local_48,local_20c,(SymStateMap *)local_218);
      if (local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_240._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_240._0_8_);
      }
      pvVar2 = (local_220->g).prods.
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar14 = pvVar2[(int)uVar19].
                super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar15 < (ulong)((long)*(pointer *)
                                      ((long)&pvVar2[(int)uVar19].
                                              super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                              ._M_impl.super__Vector_impl_data + 8) - (long)pPVar14
                              >> 2);
      uVar8 = uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
      this = local_220;
    } while (bVar4);
    return;
  }
  ppVar11 = boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
            ::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                        *)SymToState,uVar8,(uint *)local_240,
                       (equal_to<unsigned_int> *)
                       ((long)SymToState +
                       (ulong)((byte)*(table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                       *)SymToState & 1) + 1));
  if (ppVar11 == (node_pointer)0x0) {
    SVar5 = DFA<covenant::Sym>::state
                      (&this->dfa,
                       (int)((ulong)((long)(this->dfa).trans.
                                           super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->dfa).trans.
                                          super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x55555555);
    local_1b8 = CONCAT44(extraout_var,SVar5.id);
    local_240._0_8_ = local_1b8 << 0x20 | uVar8;
    boost::unordered::detail::
    table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
    ::emplace_unique<std::pair<int,unsigned_int>>
              ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                *)SymToState);
  }
  else {
    local_1b8 = (ulong)*(uint *)((long)&(ppVar11->value_base_).data_.data_ + 4);
  }
  local_1c0 = (table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
               *)((long)SymToState + 1);
  if ((this->recursive).
      super__Vector_base<covenant::RecursiveType,_std::allocator<covenant::RecursiveType>_>._M_impl.
      super__Vector_impl_data._M_start[*(uint *)((long)&(ppVar10->value_base_).data_.data_ + 4)] ==
      LEFT) {
    if (avy::AvyLogFlag != 0) {
      local_240._0_8_ = (Sym *)(local_240 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"abstraction-mkFA","");
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,(key_type *)local_240);
      if ((Sym *)local_240._0_8_ != (Sym *)(local_240 + 0x10)) {
        operator_delete((void *)local_240._0_8_);
      }
      this = local_220;
      if (cVar6._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[make_fa] A is marked as LEFT\n",0x1e);
      }
    }
    pvVar12 = CFGConnect::group(&this->conn,*(int *)((long)&(ppVar10->value_base_).data_.data_ + 4))
    ;
    std::vector<int,_std::allocator<int>_>::vector(&local_60,pvVar12);
    convert_ints_to_symbols
              ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)local_240,this,&local_60);
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_240._8_8_ != local_240._0_8_) {
      local_1c8 = &this->dfa;
      p_Var17 = (_Base_ptr)0x0;
      do {
        uVar19 = *(int *)(local_240._0_8_ + (long)p_Var17 * 4) >> 1;
        local_1f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_1f0.
                               super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,uVar19);
        local_1b0 = p_Var17;
        ppVar10 = boost::unordered::detail::
                  table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                  ::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
                            ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                              *)SymToState,(ulong)uVar19,(uint *)&local_1f0,
                             (equal_to<unsigned_int> *)
                             (local_1c0 +
                             ((byte)*(table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                      *)SymToState & 1)));
        if (ppVar10 == (node_pointer)0x0) {
          SVar5 = DFA<covenant::Sym>::state
                            (local_1c8,
                             (int)((ulong)((long)(this->dfa).trans.
                                                 super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->dfa).trans.
                                                super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                             -0x55555555);
          local_1d8 = CONCAT44(extraout_var_01,SVar5.id);
          local_1f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)(local_1d8 << 0x20 | (ulong)uVar19);
          boost::unordered::detail::
          table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
          ::emplace_unique<std::pair<int,unsigned_int>>
                    ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                      *)SymToState,&local_1f0);
        }
        else {
          local_1d8 = (ulong)*(uint *)((long)&(ppVar10->value_base_).data_.data_ + 4);
        }
        lVar13 = (long)(int)uVar19;
        pvVar2 = (this->g).prods.
                 super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1a8 = lVar13 * 3;
        pPVar14 = pvVar2[lVar13].
                  super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar2[lVar13].
                     super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                     ._M_impl.super__Vector_impl_data + 8) != pPVar14) {
          uVar8 = 0;
          do {
            std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                      (&local_1f0,
                       (this->g).rules.
                       super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + pPVar14[uVar8].rule);
            std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                      (&local_168,&local_1f0);
            std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                      (&local_198,(vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)local_240
                      );
            if (local_168.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_168.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start) {
              bVar4 = false;
            }
            else {
              uVar15 = 0;
              uVar16 = 1;
              do {
                bVar4 = std::
                        binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                                  ((__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                    )local_198.
                                     super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                   (__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                    )local_198.
                                     super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                                   local_168.
                                   super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar15);
                if (bVar4) break;
                bVar21 = uVar16 < (ulong)((long)local_168.
                                                super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_168.
                                                super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 2);
                uVar15 = uVar16;
                uVar16 = (ulong)((int)uVar16 + 1);
              } while (bVar21);
            }
            if (local_198.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start != (Sym *)0x0) {
              operator_delete(local_198.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_168.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_168.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (bVar4 == false) {
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        (&local_c0,&local_1f0);
              make_fa(local_220,local_210,&local_c0,(State)(uint)local_1d8,(SymStateMap *)local_218)
              ;
              pSVar9 = local_c0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                       _M_impl.super__Vector_impl_data._M_start;
LAB_00151f43:
              if (pSVar9 != (Sym *)0x0) {
                operator_delete(pSVar9);
              }
            }
            else {
              bVar4 = std::
                      binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                                ((__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                  )local_240._0_8_,
                                 (__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                  )local_240._8_8_,
                                 local_1f0.
                                 super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
              pSVar3 = local_1f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              pSVar9 = local_1f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (bVar4) {
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                          (&local_138,
                           (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)local_240);
                if (pSVar9 + 1 == pSVar3) {
                  if (local_138.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                      _M_impl.super__Vector_impl_data._M_start != (Sym *)0x0) {
                    operator_delete(local_138.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                else {
                  pSVar18 = pSVar9 + 2;
                  do {
                    bVar4 = std::
                            binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                                      ((__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                        )local_138.
                                         super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                       (__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                        )local_138.
                                         super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,pSVar18 + -1);
                    bVar21 = pSVar18 != pSVar3;
                    pSVar18 = pSVar18 + 1;
                  } while (bVar21 && !bVar4);
                  if (local_138.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                      _M_impl.super__Vector_impl_data._M_start != (Sym *)0x0) {
                    operator_delete(local_138.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (bVar4) goto LAB_00151f4d;
                }
                iVar1 = (local_1f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                         ._M_impl.super__Vector_impl_data._M_start)->x;
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                          (&local_208,&local_1f0);
                remove<covenant::Sym>(&local_208,0);
                uVar19 = iVar1 >> 1;
                local_1d0 = CONCAT44(local_1d0._4_4_,uVar19);
                ppVar10 = boost::unordered::detail::
                          table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                          ::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
                                    (local_218,(ulong)uVar19,(uint *)&local_1d0,
                                     (equal_to<unsigned_int> *)(local_1c0 + ((byte)*local_218 & 1)))
                ;
                if (ppVar10 == (node_pointer)0x0) {
                  SVar5 = DFA<covenant::Sym>::state
                                    (local_1c8,
                                     (int)((ulong)((long)(local_220->dfa).trans.
                                                                                                                  
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(local_220->dfa).trans.
                                                                                                                
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                     -0x55555555);
                  local_1d0 = CONCAT44(SVar5.id,uVar19);
                  boost::unordered::detail::
                  table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                  ::emplace_unique<std::pair<int,unsigned_int>>(local_218,&local_1d0);
                }
                else {
                  SVar5.id = *(uint *)((long)&(ppVar10->value_base_).data_.data_ + 4);
                }
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                          (&local_d8,&local_208);
                make_fa(local_220,SVar5,&local_d8,(State)(uint)local_1d8,(SymStateMap *)local_218);
                pSVar9 = local_208.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_d8.
                                  super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                  pSVar9 = local_208.
                           super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl
                           .super__Vector_impl_data._M_start;
                }
                goto LAB_00151f43;
              }
            }
LAB_00151f4d:
            if (local_1f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start != (Sym *)0x0) {
              operator_delete(local_1f0.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            uVar8 = (ulong)((int)uVar8 + 1);
            pvVar2 = (local_220->g).prods.
                     super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pPVar14 = *(pointer *)
                       ((long)&(pvVar2->
                               super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                               )._M_impl.super__Vector_impl_data + local_1a8 * 8);
            this = local_220;
          } while (uVar8 < (ulong)(*(long *)((long)&(pvVar2->
                                                  super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                                  )._M_impl.super__Vector_impl_data +
                                            local_1a8 * 8 + 8) - (long)pPVar14 >> 2));
        }
        p_Var17 = (_Base_ptr)(ulong)((int)local_1b0 + 1);
        SymToState = (SymStateMap *)local_218;
      } while (p_Var17 < (_Base_ptr)((long)(local_240._8_8_ - local_240._0_8_) >> 2));
    }
    DFA<covenant::Sym>::eps_transition(&this->dfa,(State)(uint)local_1b8,local_20c);
    pSVar9 = (pointer)local_240._0_8_;
  }
  else {
    if (avy::AvyLogFlag != 0) {
      local_240._0_8_ = (Sym *)(local_240 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"abstraction-mkFA","");
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,(key_type *)local_240);
      if ((Sym *)local_240._0_8_ != (Sym *)(local_240 + 0x10)) {
        operator_delete((void *)local_240._0_8_);
      }
      this = local_220;
      if (cVar6._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[make_fa] A is marked as RIGHT/CYCLIC\n",0x26);
      }
    }
    pvVar12 = CFGConnect::group(&this->conn,*(int *)((long)&(ppVar10->value_base_).data_.data_ + 4))
    ;
    std::vector<int,_std::allocator<int>_>::vector(&local_78,pvVar12);
    convert_ints_to_symbols(&local_1f0,this,&local_78);
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_1a0 = &this->dfa;
      pDVar20 = (DFA<covenant::Sym> *)0x0;
      local_1b0 = (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
      do {
        uVar19 = local_1f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl
                 .super__Vector_impl_data._M_start[(long)pDVar20].x >> 1;
        local_240._0_4_ = uVar19;
        ppVar10 = boost::unordered::detail::
                  table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                  ::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
                            (local_218,(ulong)uVar19,(uint *)local_240,
                             (equal_to<unsigned_int> *)(local_1c0 + ((byte)*local_218 & 1)));
        local_1c8 = pDVar20;
        if (ppVar10 == (node_pointer)0x0) {
          SVar5 = DFA<covenant::Sym>::state
                            (local_1a0,
                             (int)((ulong)((long)(this->dfa).trans.
                                                 super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->dfa).trans.
                                                super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                             -0x55555555);
          local_1d8 = CONCAT44(extraout_var_00,SVar5.id);
          local_240._0_8_ = local_1d8 << 0x20 | (ulong)uVar19;
          boost::unordered::detail::
          table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
          ::emplace_unique<std::pair<int,unsigned_int>>(local_218,local_240);
        }
        else {
          local_1d8 = (ulong)*(uint *)((long)&(ppVar10->value_base_).data_.data_ + 4);
        }
        lVar13 = (long)(int)uVar19;
        pvVar2 = (this->g).prods.
                 super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1a8 = lVar13 * 3;
        pPVar14 = pvVar2[lVar13].
                  super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar2[lVar13].
                     super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                     ._M_impl.super__Vector_impl_data + 8) != pPVar14) {
          uVar8 = 0;
          do {
            std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                      (&local_208,
                       (this->g).rules.
                       super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + pPVar14[uVar8].rule);
            if (avy::AvyLogFlag == 1) {
              local_240._0_8_ = local_240 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_240,"abstraction-mkFA","");
              cVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)avy::AvyLog_abi_cxx11_,(key_type *)local_240);
              if ((Sym *)local_240._0_8_ != (Sym *)(local_240 + 0x10)) {
                operator_delete((void *)local_240._0_8_);
              }
              if (cVar6._M_node != local_1b0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
                if (local_208.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_208.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  uVar15 = 0;
                  uVar16 = 1;
                  do {
                    poVar7 = operator<<((ostream *)&std::cout,
                                        (Sym)local_208.
                                             super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar15].x);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
                    bVar4 = uVar16 < (ulong)((long)local_208.
                                                                                                      
                                                  super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_208.
                                                                                                      
                                                  super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2);
                    uVar15 = uVar16;
                    uVar16 = (ulong)((int)uVar16 + 1);
                  } while (bVar4);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
              }
            }
            std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                      (&local_180,&local_208);
            std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                      (&local_120,&local_1f0);
            if (local_180.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_180.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start) {
              bVar4 = false;
            }
            else {
              uVar15 = 0;
              uVar16 = 1;
              do {
                bVar4 = std::
                        binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                                  ((__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                    )local_120.
                                     super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                   (__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                    )local_120.
                                     super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                                   local_180.
                                   super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar15);
                if (bVar4) break;
                bVar21 = uVar16 < (ulong)((long)local_180.
                                                super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_180.
                                                super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 2);
                uVar15 = uVar16;
                uVar16 = (ulong)((int)uVar16 + 1);
              } while (bVar21);
            }
            if (local_120.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start != (Sym *)0x0) {
              operator_delete(local_120.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_180.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_180.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (bVar4 == false) {
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        (&local_f0,&local_208);
              make_fa(this,(State)(uint)local_1d8,&local_f0,local_20c,(SymStateMap *)local_218);
              pSVar9 = local_f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                       _M_impl.super__Vector_impl_data._M_start;
LAB_00151a5e:
              if (pSVar9 != (Sym *)0x0) {
                operator_delete(pSVar9);
              }
            }
            else {
              bVar4 = std::
                      binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                                ((__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                  )local_1f0.
                                   super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                 (__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                  )local_1f0.
                                   super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                 local_208.
                                 super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -1);
              pSVar3 = local_208.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              pSVar9 = local_208.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (bVar4) {
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                          (&local_150,&local_1f0);
                this = local_220;
                if (pSVar9 == pSVar3 + -1) {
                  if (local_150.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                      _M_impl.super__Vector_impl_data._M_start != (Sym *)0x0) {
                    operator_delete(local_150.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                else {
                  do {
                    bVar4 = std::
                            binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                                      ((__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                        )local_150.
                                         super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                       (__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                        )local_150.
                                         super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,pSVar9);
                    this = local_220;
                    pSVar9 = pSVar9 + 1;
                  } while (pSVar9 != pSVar3 + -1 && !bVar4);
                  if (local_150.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                      _M_impl.super__Vector_impl_data._M_start != (Sym *)0x0) {
                    operator_delete(local_150.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (bVar4) goto LAB_00151a68;
                }
                iVar1 = local_208.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].x;
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                          ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)local_240,
                           &local_208);
                remove<covenant::Sym>
                          ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)local_240,
                           ((long)local_208.
                                  super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_208.
                                  super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2) - 1);
                uVar19 = iVar1 >> 1;
                local_1d0 = CONCAT44(local_1d0._4_4_,uVar19);
                ppVar10 = boost::unordered::detail::
                          table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                          ::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
                                    (local_218,(ulong)uVar19,(uint *)&local_1d0,
                                     (equal_to<unsigned_int> *)(local_1c0 + ((byte)*local_218 & 1)))
                ;
                if (ppVar10 == (node_pointer)0x0) {
                  SVar5 = DFA<covenant::Sym>::state
                                    (local_1a0,
                                     (int)((ulong)((long)(this->dfa).trans.
                                                                                                                  
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->dfa).trans.
                                                                                                                
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                     -0x55555555);
                  local_1d0 = CONCAT44(SVar5.id,uVar19);
                  boost::unordered::detail::
                  table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                  ::emplace_unique<std::pair<int,unsigned_int>>(local_218,&local_1d0);
                }
                else {
                  SVar5.id = *(uint *)((long)&(ppVar10->value_base_).data_.data_ + 4);
                }
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                          (&local_108,
                           (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)local_240);
                make_fa(this,(State)(uint)local_1d8,&local_108,SVar5,(SymStateMap *)local_218);
                pSVar9 = (pointer)local_240._0_8_;
                if (local_108.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_108.
                                  super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                  pSVar9 = (pointer)local_240._0_8_;
                }
                goto LAB_00151a5e;
              }
            }
LAB_00151a68:
            if (local_208.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start != (Sym *)0x0) {
              operator_delete(local_208.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            uVar8 = (ulong)((int)uVar8 + 1);
            pvVar2 = (this->g).prods.
                     super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pPVar14 = *(pointer *)
                       ((long)&(pvVar2->
                               super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                               )._M_impl.super__Vector_impl_data + local_1a8 * 8);
          } while (uVar8 < (ulong)(*(long *)((long)&(pvVar2->
                                                  super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                                  )._M_impl.super__Vector_impl_data +
                                            local_1a8 * 8 + 8) - (long)pPVar14 >> 2));
        }
        pDVar20 = (DFA<covenant::Sym> *)(ulong)((int)local_1c8 + 1);
      } while (pDVar20 < (DFA<covenant::Sym> *)
                         ((long)local_1f0.
                                super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1f0.
                                super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2));
    }
    DFA<covenant::Sym>::eps_transition(&this->dfa,local_210,(State)(uint)local_1b8);
    pSVar9 = local_1f0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
LAB_00151ae9:
  if (pSVar9 != (Sym *)0x0) {
    operator_delete(pSVar9);
  }
  return;
}

Assistant:

void make_fa(const State q_0, 
               const vector<EdgeSym> alpha, 
               const State q_1, 
               SymStateMap &SymToState) 
  {

    LOG ("abstraction-mkFA", 
         cout << "reading word " << alpha 
         << " with size " << alpha.size() << endl);

    if (alpha.size() == 0)
    {

      LOG ("abstraction-mkFA", 
           cout << "[make_fa] reading epsilon\n");

      dfa.eps_transition(q_0,q_1);
      return;
    }
    else if (alpha.size () == 1 && alpha[0].isTerm ())
    {

      LOG ("abstraction-mkFA", 
           cout << "[make_fa] (case A->a) reading " << alpha << endl);

      dfa.transition(q_0, alpha[0], q_1);
      return;
    }
    else if (alpha.size() >= 2)
    {
      vector<EdgeSym> beta(alpha);
      remove(beta,0);
      State q_2 = dfa.state(dfa.nStates());
      vector<EdgeSym> gamma;
      gamma.push_back(alpha[0]);

      LOG ("abstraction-mkFA",
           cout << "[make_fa] (case A-> BC) reading " << gamma << " " 
           << beta << endl);

      make_fa(q_0, gamma, q_2, SymToState);
      make_fa(q_2, beta , q_1, SymToState);
      return;
    }
    else
    {
      //assert(alpha.size() == 1 && isVar(alpha[0]));

      LOG ("abstraction-mkFA", 
           cout << "[make_fa] (case A->B) reading " << alpha << endl);

      EdgeSym A =  alpha[0];	
      SymSCCMap::iterator It = sym_scc_map.find(A.symID ());
      if (recursive[(*It).second] == NON_REC)
      {

        LOG ("abstraction-mkFA", 
             cout << "[make_fa] A is not recursive\n ");

        for ( unsigned int ri = 0; ri < g.prods[A.symID()].size(); ri++ )
        {
          int r = g.prods[A.symID ()][ri].rule;
          vector<EdgeSym> RHS = g.rules[r];
          make_fa(q_0, RHS, q_1, SymToState);
        }
        return;
      }
        
      State q_A = MapSymToState(SymToState, A);
      if (recursive[(*It).second] == LEFT)
      {

        LOG ("abstraction-mkFA", 
             cout << "[make_fa] A is marked as LEFT\n");

        // GroupSyms must be sorted
        vector<EdgeSym> GroupSyms = convert_ints_to_symbols(conn.group((*It).second));
        for (unsigned int gi =0; gi < GroupSyms.size() ; gi ++)
        {
          EdgeSym C = GroupSyms[gi];
          State q_C = MapSymToState(SymToState, C);
          for ( unsigned int ri = 0; ri < g.prods[C.symID ()].size(); ri++ )
          {
            int r = g.prods[C.symID ()][ri].rule;
            vector<EdgeSym> RHS = g.rules[r];
              
            if (!intersect_unorder_ord(RHS, GroupSyms))
              make_fa(q_0, RHS, q_C, SymToState);
            else{
              if (binary_search(GroupSyms.begin(),GroupSyms.end(), RHS[0]) &&
                  (!intersect_unorder_ord(++RHS.begin(), RHS.end(), GroupSyms)))
              {
                EdgeSym D = RHS[0];
                vector<EdgeSym> beta(RHS);
                remove(beta,0);
                State q_D = MapSymToState(SymToState, D);
                make_fa(q_D, beta, q_C, SymToState);
              }		    
            }
          }
        }
        dfa.eps_transition(q_A,q_1);
      } // end LEFT
      else
      {
        /////
        // RIGHT or CYCLIC: code almost identical
        /////

        LOG ("abstraction-mkFA", 
             cout << "[make_fa] A is marked as RIGHT/CYCLIC\n"); 

        vector<EdgeSym> GroupSyms = convert_ints_to_symbols(conn.group((*It).second));
        for (unsigned int gi =0; gi < GroupSyms.size() ; gi ++)
        {
          EdgeSym C = GroupSyms[gi];
          State q_C = MapSymToState(SymToState, C);
          for ( unsigned int ri = 0; ri < g.prods[C.symID ()].size(); ri++ )
          {
            int r = g.prods[C.symID ()][ri].rule;
            vector<EdgeSym> RHS = g.rules[r];

            LOG ("abstraction-mkFA", cout << RHS << "   " );

            if (!intersect_unorder_ord(RHS, GroupSyms))
              make_fa(q_C, RHS, q_1, SymToState);
            else
            {
              if (binary_search(GroupSyms.begin(),GroupSyms.end(), RHS[RHS.size()-1]) &&
                  (!intersect_unorder_ord(RHS.begin(), RHS.end()-1, GroupSyms)))
              {
                EdgeSym D = RHS[RHS.size()-1];
                vector<EdgeSym> beta(RHS);
                remove(beta,RHS.size()-1);
                State q_D = MapSymToState(SymToState, D);
                make_fa(q_C, beta, q_D,  SymToState);
              }		    
            }
          }
        }
        dfa.eps_transition(q_0,q_A);
      } // end RIGHT or CYCLIC	
      return;
    }
  }